

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::internal::UnitTestImpl::ListTestsMatchingFilter(UnitTestImpl *this)

{
  TestCase *pTVar1;
  TestInfo *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer ppTVar4;
  pointer ppTVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  pointer pcVar9;
  bool bVar10;
  
  ppTVar4 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->test_cases_).
      super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar4) {
    uVar7 = 0;
    do {
      pTVar1 = ppTVar4[uVar7];
      ppTVar5 = (pTVar1->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((pTVar1->test_info_list_).
          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppTVar5) {
        uVar6 = 0;
        bVar10 = false;
        do {
          pTVar2 = ppTVar5[uVar6];
          if (pTVar2->matches_filter_ == true) {
            if (!bVar10) {
              printf("%s.",(pTVar1->name_)._M_dataplus._M_p);
              pbVar3 = (pTVar1->type_param_).ptr_;
              if ((pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0) && ((pbVar3->_M_dataplus)._M_p != (pointer)0x0)) {
                iVar8 = 0x13ec12;
                printf("  # %s = ");
                pbVar3 = (pTVar1->type_param_).ptr_;
                if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                  pcVar9 = (char *)0x0;
                }
                else {
                  pcVar9 = (pbVar3->_M_dataplus)._M_p;
                }
                PrintOnOneLine(pcVar9,iVar8);
              }
              putchar(10);
              bVar10 = true;
            }
            printf("  %s",(pTVar2->name_)._M_dataplus._M_p);
            pbVar3 = (pTVar2->value_param_).ptr_;
            if ((pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
               && ((pbVar3->_M_dataplus)._M_p != (pointer)0x0)) {
              iVar8 = 0x13ec1c;
              printf("  # %s = ");
              pbVar3 = (pTVar2->value_param_).ptr_;
              if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 ) {
                pcVar9 = (char *)0x0;
              }
              else {
                pcVar9 = (pbVar3->_M_dataplus)._M_p;
              }
              PrintOnOneLine(pcVar9,iVar8);
            }
            putchar(10);
          }
          uVar6 = uVar6 + 1;
          ppTVar5 = (pTVar1->test_info_list_).
                    super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar6 < (ulong)((long)(pTVar1->test_info_list_).
                                       super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5 >>
                                3));
      }
      uVar7 = uVar7 + 1;
      ppTVar4 = (this->test_cases_).
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->test_cases_).
                                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4 >> 3))
    ;
  }
  fflush(_stdout);
  return;
}

Assistant:

Message& Message::operator <<(const wchar_t* wide_c_str) {
  return *this << internal::String::ShowWideCString(wide_c_str);
}